

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O2

bool __thiscall sf::priv::GlxContext::makeCurrent(GlxContext *this,bool current)

{
  int iVar1;
  GLXContext p_Var2;
  Window WVar3;
  Display *pDVar4;
  
  p_Var2 = this->m_context;
  if (p_Var2 == (GLXContext)0x0) {
    return false;
  }
  if (current) {
    if (this->m_pbuffer != 0) {
      iVar1 = glXMakeContextCurrent(this->m_display,this->m_pbuffer);
      goto LAB_0011b827;
    }
    WVar3 = this->m_window;
    if (WVar3 == 0) {
      return false;
    }
    pDVar4 = this->m_display;
  }
  else {
    pDVar4 = this->m_display;
    WVar3 = 0;
    p_Var2 = (GLXContext)0x0;
  }
  iVar1 = glXMakeCurrent(pDVar4,WVar3,p_Var2);
LAB_0011b827:
  return iVar1 != 0;
}

Assistant:

bool GlxContext::makeCurrent(bool current)
{
    if (!m_context)
        return false;

#if defined(GLX_DEBUGGING)
    GlxErrorHandler handler(m_display);
#endif

    bool result = false;

    if (current)
    {
        if (m_pbuffer)
        {
            result = glXMakeContextCurrent(m_display, m_pbuffer, m_pbuffer, m_context);
        }
        else if (m_window)
        {
            result = glXMakeCurrent(m_display, m_window, m_context);
        }
    }
    else
    {
        result = glXMakeCurrent(m_display, None, NULL);
    }

#if defined(GLX_DEBUGGING)
    if (glxErrorOccurred)
        err() << "GLX error in GlxContext::makeCurrent()" << std::endl;
#endif

    return result;
}